

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_credential.cc
# Opt level: O1

bool __thiscall ssl_credential_st::UsesPrivateKey(ssl_credential_st *this)

{
  if (this->type < 4) {
    return (3U >> (this->type & 0xf) & 1) != 0;
  }
  abort();
}

Assistant:

bool ssl_credential_st::UsesPrivateKey() const {
  switch (type) {
    case SSLCredentialType::kX509:
    case SSLCredentialType::kDelegated:
      return true;
    case SSLCredentialType::kSPAKE2PlusV1Client:
    case SSLCredentialType::kSPAKE2PlusV1Server:
      return false;
  }
  abort();
}